

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_BooleanReturnValue_TestShell::
~TEST_MockReturnValueTest_BooleanReturnValue_TestShell
          (TEST_MockReturnValueTest_BooleanReturnValue_TestShell *this)

{
  TEST_MockReturnValueTest_BooleanReturnValue_TestShell *this_local;
  
  ~TEST_MockReturnValueTest_BooleanReturnValue_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockReturnValueTest, BooleanReturnValue)
{
    bool expected_value = true;
    mock().expectOneCall("foo").andReturnValue(true);
    MockActualCall& actual_call = mock().actualCall("foo");

    CHECK_EQUAL(expected_value, actual_call.returnValue().getBoolValue());
    CHECK_EQUAL(expected_value, actual_call.returnBoolValue());

    CHECK_EQUAL(expected_value, mock().returnValue().getBoolValue());
    CHECK_EQUAL(expected_value, mock().boolReturnValue());
}